

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O1

void __thiscall
helics::PublicationInfo::disconnectFederate(PublicationInfo *this,GlobalFederateId fedToDisconnect)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  pointer pSVar4;
  iterator __first;
  
  pSVar4 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = ((long)pSVar1 - (long)pSVar4 >> 3) * -0x3333333333333333 >> 2;
  pSVar2 = pSVar4;
  if (0 < lVar3) {
    pSVar2 = pSVar4 + lVar3 * 4;
    lVar3 = lVar3 + 1;
    __first._M_current = pSVar4 + 2;
    do {
      if (__first._M_current[-2].id.fed_id.gid == fedToDisconnect.gid) {
        __first._M_current = __first._M_current + -2;
        goto LAB_00337f18;
      }
      if (__first._M_current[-1].id.fed_id.gid == fedToDisconnect.gid) {
        __first._M_current = __first._M_current + -1;
        goto LAB_00337f18;
      }
      if (((__first._M_current)->id).fed_id.gid == fedToDisconnect.gid) goto LAB_00337f18;
      if (__first._M_current[1].id.fed_id.gid == fedToDisconnect.gid) {
        __first._M_current = __first._M_current + 1;
        goto LAB_00337f18;
      }
      lVar3 = lVar3 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar3);
  }
  lVar3 = ((long)pSVar1 - (long)pSVar2 >> 3) * -0x3333333333333333;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      __first._M_current = pSVar1;
      if ((lVar3 != 3) ||
         (__first._M_current = pSVar2, (pSVar2->id).fed_id.gid == fedToDisconnect.gid))
      goto LAB_00337f18;
      pSVar2 = pSVar2 + 1;
    }
    __first._M_current = pSVar2;
    if ((pSVar2->id).fed_id.gid == fedToDisconnect.gid) goto LAB_00337f18;
    pSVar2 = pSVar2 + 1;
  }
  __first._M_current = pSVar2;
  if ((pSVar2->id).fed_id.gid != fedToDisconnect.gid) {
    __first._M_current = pSVar1;
  }
LAB_00337f18:
  pSVar4 = __first._M_current + 1;
  if (pSVar4 != pSVar1 && __first._M_current != pSVar1) {
    do {
      if ((pSVar4->id).fed_id.gid != fedToDisconnect.gid) {
        (__first._M_current)->id = pSVar4->id;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&(__first._M_current)->key,&pSVar4->key);
        __first._M_current = __first._M_current + 1;
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
  _M_erase(&this->subscribers,__first,
           (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void PublicationInfo::disconnectFederate(GlobalFederateId fedToDisconnect)
{
    subscribers.erase(std::remove_if(subscribers.begin(),
                                     subscribers.end(),
                                     [fedToDisconnect](const auto& val) {
                                         return val.id.fed_id == fedToDisconnect;
                                     }),
                      subscribers.end());
}